

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# generator_unittest.cc
# Opt level: O0

void __thiscall
google::protobuf::compiler::java::anon_unknown_0::JavaGeneratorTest_BasicError_Test::
~JavaGeneratorTest_BasicError_Test(JavaGeneratorTest_BasicError_Test *this)

{
  JavaGeneratorTest_BasicError_Test *this_local;
  
  ~JavaGeneratorTest_BasicError_Test(this);
  operator_delete(this,0x2d0);
  return;
}

Assistant:

TEST_F(JavaGeneratorTest, BasicError) {
  CreateTempFile("foo.proto",
                 R"schema(
    syntax = "proto2";
    message Foo {
      int32 bar = 1;
    })schema");

  RunProtoc(
      "protocol_compiler --proto_path=$tmpdir --java_out=$tmpdir foo.proto");

  ExpectErrorSubstring(
      "foo.proto:4:7: Expected \"required\", \"optional\", or \"repeated\"");
}